

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * mg_strndup_ctx(char *ptr,size_t len,mg_context *ctx)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar2 = (char *)malloc(len + 1);
  if (pcVar2 != (char *)0x0) {
    cVar3 = *ptr;
    pcVar4 = pcVar2;
    if (1 < len + 1 && cVar3 != '\0') {
      pcVar5 = ptr + 1;
      do {
        *pcVar4 = cVar3;
        pcVar4 = pcVar4 + 1;
        cVar3 = *pcVar5;
        if (cVar3 == '\0') break;
        pcVar5 = pcVar5 + 1;
        bVar1 = 1 < len;
        len = len - 1;
      } while (bVar1);
    }
    *pcVar4 = '\0';
  }
  return pcVar2;
}

Assistant:

static char *
mg_strndup_ctx(const char *ptr, size_t len, struct mg_context *ctx)
{
	char *p;
	(void)ctx; /* Avoid Visual Studio warning if USE_SERVER_STATS is not
	            * defined */

	if ((p = (char *)mg_malloc_ctx(len + 1, ctx)) != NULL) {
		mg_strlcpy(p, ptr, len + 1);
	}

	return p;
}